

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O2

void __thiscall
tcpp::Preprocessor::_processElseConditional(Preprocessor *this,TIfStackEntry *currStackEntry)

{
  byte bVar1;
  TErrorInfo local_10;
  
  if (currStackEntry->mHasElseBeenFound == true) {
    local_10.mType = ANOTHER_ELSE_BLOCK_FOUND;
    local_10.mLine = this->mpLexer->mCurrLineIndex;
    Catch::clara::std::function<void_(const_tcpp::TErrorInfo_&)>::operator()
              ((function<void_(const_tcpp::TErrorInfo_&)> *)&this->mOnErrorCallback,&local_10);
  }
  else {
    bVar1 = true;
    if (currStackEntry->mHasIfBlockBeenEntered == false) {
      bVar1 = currStackEntry->mShouldBeSkipped ^ 1;
    }
    currStackEntry->mShouldBeSkipped = (bool)bVar1;
    currStackEntry->mHasElseBeenFound = true;
  }
  return;
}

Assistant:

void Preprocessor::_processElseConditional(TIfStackEntry& currStackEntry) TCPP_NOEXCEPT
	{
		if (currStackEntry.mHasElseBeenFound)
		{
			mOnErrorCallback({ E_ERROR_TYPE::ANOTHER_ELSE_BLOCK_FOUND, mpLexer->GetCurrLineIndex() });
			return;
		}

		currStackEntry.mShouldBeSkipped  = 
			currStackEntry.mHasIfBlockBeenEntered || 
			!currStackEntry.mShouldBeSkipped;

		currStackEntry.mHasElseBeenFound = true;
	}